

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.h
# Opt level: O0

void __thiscall cnn::Dict::SetUnk(Dict *this,string *word)

{
  int iVar1;
  runtime_error *prVar2;
  byte *in_RDI;
  Dict *in_stack_00000038;
  
  if ((*in_RDI & 1) == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Please call SetUnk() only after dictionary is frozen")
    ;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((in_RDI[1] & 1) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Set UNK more than one time");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *in_RDI = 0;
  iVar1 = Convert(in_stack_00000038,(string *)this);
  *(int *)(in_RDI + 4) = iVar1;
  *in_RDI = 1;
  in_RDI[1] = 1;
  return;
}

Assistant:

void SetUnk(const std::string& word) {
    if (!frozen)
      throw std::runtime_error("Please call SetUnk() only after dictionary is frozen");
    if (map_unk)
      throw std::runtime_error("Set UNK more than one time");
  
    // temporarily unfrozen the dictionary to allow the add of the UNK
    frozen = false;
    unk_id = Convert(word);
    frozen = true;
  
    map_unk = true;
  }